

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void start_pass_main(j_decompress_ptr cinfo,J_BUF_MODE pass_mode)

{
  jpeg_d_main_controller *pjVar1;
  int in_ESI;
  j_decompress_ptr in_RDI;
  my_main_ptr_conflict main_ptr;
  
  pjVar1 = in_RDI->main;
  if (in_ESI == 0) {
    if (in_RDI->upsample->need_context_rows == 0) {
      pjVar1->process_data = process_data_simple_main;
    }
    else {
      pjVar1->process_data = process_data_context_main;
      make_funny_pointers(in_RDI);
      *(undefined4 *)&pjVar1[7].process_data = 0;
      *(undefined4 *)((long)&pjVar1[7].process_data + 4) = 0;
      *(undefined4 *)((long)&pjVar1[8].start_pass + 4) = 0;
    }
    *(undefined4 *)&pjVar1[6].start_pass = 0;
    *(undefined4 *)((long)&pjVar1[6].start_pass + 4) = 0;
  }
  else if (in_ESI == 2) {
    pjVar1->process_data = process_data_crank_post;
  }
  else {
    in_RDI->err->msg_code = 4;
    (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_main(j_decompress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;

  switch (pass_mode) {
  case JBUF_PASS_THRU:
    if (cinfo->upsample->need_context_rows) {
      main_ptr->pub.process_data = process_data_context_main;
      make_funny_pointers(cinfo); /* Create the xbuffer[] lists */
      main_ptr->whichptr = 0;   /* Read first iMCU row into xbuffer[0] */
      main_ptr->context_state = CTX_PREPARE_FOR_IMCU;
      main_ptr->iMCU_row_ctr = 0;
    } else {
      /* Simple case with no context needed */
      main_ptr->pub.process_data = process_data_simple_main;
    }
    main_ptr->buffer_full = FALSE;      /* Mark buffer empty */
    main_ptr->rowgroup_ctr = 0;
    break;
#ifdef QUANT_2PASS_SUPPORTED
  case JBUF_CRANK_DEST:
    /* For last pass of 2-pass quantization, just crank the postprocessor */
    main_ptr->pub.process_data = process_data_crank_post;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    break;
  }
}